

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3GetToken(uchar *z,int *tokenType)

{
  uchar *puVar1;
  uchar uVar2;
  long lVar3;
  long lVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  
  bVar10 = *z;
  lVar3 = 1;
  switch("\x1c\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\a\a\x1b\a\a\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\a\x0f\b\x05\x04\x16\x18\b\x11\x12\x15\x14\x17\v\x1a\x10\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x05\x13\f\x0e\r\x06\x05\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
         [bVar10]) {
  case '\0':
    if (z[1] == '\'') {
      *tokenType = 0x92;
      uVar9 = 1;
      do {
        lVar3 = uVar9 + 1;
        uVar9 = uVar9 + 1;
      } while ((""[z[lVar3]] & 8) != 0);
      if ((uVar9 & 1) != 0 || z[lVar3] != 0x27) {
        *tokenType = 0xaf;
        for (; (z[uVar9] != '\0' && (z[uVar9] != '\'')); uVar9 = uVar9 + 1) {
        }
      }
      uVar9 = (ulong)(((int)uVar9 + 1) - (uint)(z[(int)uVar9] == '\0'));
      goto LAB_0015716f;
    }
  case '\x02':
switchD_00156c4c_caseD_2:
    uVar9 = (ulong)((int)lVar3 - 1);
    pbVar5 = z + lVar3;
    do {
      bVar10 = *pbVar5;
      uVar9 = (ulong)((int)uVar9 + 1);
      pbVar5 = pbVar5 + 1;
    } while ((""[bVar10] & 0x46) != 0);
    *tokenType = 0x3b;
    goto LAB_0015716f;
  case '\x01':
    uVar9 = 0;
    lVar3 = 0x100000000;
    do {
      lVar4 = uVar9 + 1;
      lVar3 = lVar3 + 0x100000000;
      uVar9 = uVar9 + 1;
    } while ("\x1c\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\a\a\x1b\a\a\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\a\x0f\b\x05\x04\x16\x18\b\x11\x12\x15\x14\x17\v\x1a\x10\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x05\x13\f\x0e\r\x06\x05\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
             [z[lVar4]] < 2);
    if ((""[z[lVar4]] & 0x46) == 0) {
      *tokenType = 0x3b;
      keywordCode((char *)z,(int)uVar9,tokenType);
      goto LAB_0015716f;
    }
    lVar3 = lVar3 >> 0x20;
    goto switchD_00156c4c_caseD_2;
  case '\x03':
    goto switchD_00156c4c_caseD_3;
  case '\x04':
  case '\x05':
    *tokenType = 0x94;
    bVar10 = z[1];
    uVar9 = 1;
    if (bVar10 == 0) {
      bVar13 = true;
    }
    else {
      iVar7 = 0;
      do {
        iVar6 = (int)uVar9;
        if ((""[bVar10] & 0x46) == 0) {
          if (0 < iVar7 && bVar10 == 0x28) {
            uVar8 = iVar6 + 1;
            pbVar5 = z + iVar6;
            goto LAB_00157180;
          }
          if ((bVar10 != 0x3a) || (z[(long)iVar6 + 1] != ':')) break;
          iVar6 = iVar6 + 1;
        }
        else {
          iVar7 = iVar7 + 1;
        }
        bVar10 = z[(long)iVar6 + 1];
        uVar9 = (long)iVar6 + 1;
      } while (bVar10 != 0);
      bVar13 = iVar7 == 0;
    }
    goto LAB_0015707e;
  case '\x06':
    *tokenType = 0x94;
    uVar9 = 0;
    do {
      lVar3 = uVar9 + 1;
      uVar9 = uVar9 + 1;
    } while (0xfffffffffffffff5 < (ulong)z[lVar3] - 0x3a);
    goto LAB_0015716f;
  case '\a':
    uVar9 = 0;
    do {
      lVar3 = uVar9 + 1;
      uVar9 = uVar9 + 1;
    } while ((""[z[lVar3]] & 1) != 0);
    goto LAB_001571c5;
  case '\b':
    bVar11 = z[1];
    bVar13 = bVar11 == 0;
    if (bVar13) {
      bVar14 = false;
      uVar9 = 1;
    }
    else {
      uVar9 = 1;
      do {
        iVar7 = (int)uVar9;
        if (bVar11 == bVar10) {
          if (z[(long)iVar7 + 1] != bVar10) break;
          iVar7 = iVar7 + 1;
        }
        bVar11 = z[(long)iVar7 + 1];
        uVar9 = (long)iVar7 + 1;
        bVar13 = bVar11 == 0;
      } while (!bVar13);
      bVar14 = bVar11 == 0x27;
    }
    uVar8 = (uint)uVar9;
    if (bVar14) {
      *tokenType = 0x6e;
      goto LAB_001570f5;
    }
    if (!bVar13) {
      *tokenType = 0x3b;
      goto LAB_001570f5;
    }
    goto LAB_00157086;
  case '\t':
    if (bVar10 == 0x5d) {
      iVar7 = 0x3b;
      uVar9 = 1;
    }
    else {
      uVar9 = 1;
      do {
        puVar1 = z + uVar9;
        if (*puVar1 == '\0') {
          iVar7 = 0xaf;
          goto LAB_0015711d;
        }
        uVar9 = uVar9 + 1;
      } while (*puVar1 != ']');
      iVar7 = 0x3b;
    }
LAB_0015711d:
    *tokenType = iVar7;
    goto LAB_0015716f;
  case '\n':
    if (z[1] != '|') {
      *tokenType = 0x61;
      break;
    }
    *tokenType = 0x69;
    goto LAB_0015715d;
  case '\v':
    if (z[1] != '-') {
      *tokenType = 0x65;
      break;
    }
    for (uVar9 = 2; (z[uVar9] != '\0' && (z[uVar9] != '\n')); uVar9 = uVar9 + 1) {
    }
    goto LAB_001571c5;
  case '\f':
    uVar2 = z[1];
    if (uVar2 == '<') {
      *tokenType = 0x62;
    }
    else {
      if (uVar2 == '>') goto LAB_00157091;
      if (uVar2 != '=') {
        *tokenType = 0x38;
        break;
      }
      *tokenType = 0x37;
    }
    goto LAB_0015715d;
  case '\r':
    if (z[1] == '>') {
      *tokenType = 99;
    }
    else {
      if (z[1] != '=') {
        *tokenType = 0x36;
        break;
      }
      *tokenType = 0x39;
    }
    goto LAB_0015715d;
  case '\x0e':
    *tokenType = 0x35;
    uVar8 = (uint)(z[1] == '=');
LAB_001570f5:
    uVar9 = (ulong)(uVar8 + 1);
    goto LAB_0015716f;
  case '\x0f':
    if (z[1] != '=') goto switchD_00156c4c_caseD_1b;
LAB_00157091:
    *tokenType = 0x34;
LAB_0015715d:
    uVar9 = 2;
    goto LAB_0015716f;
  case '\x10':
    if ((z[1] != '*') || (uVar2 = z[2], uVar2 == '\0')) {
      *tokenType = 0x67;
      break;
    }
    lVar3 = 3;
    do {
      lVar4 = lVar3;
      if ((uVar2 == '*') && (z[lVar4] == '/')) {
        iVar7 = 1;
        goto LAB_001571c3;
      }
      uVar2 = z[lVar4];
      lVar3 = lVar4 + 1;
    } while (uVar2 != '\0');
    iVar7 = 0;
LAB_001571c3:
    uVar9 = (ulong)(uint)((int)lVar4 + iVar7);
LAB_001571c5:
    *tokenType = 0xae;
    goto LAB_0015716f;
  case '\x11':
    *tokenType = 0x16;
    break;
  case '\x12':
    *tokenType = 0x17;
    break;
  case '\x13':
    *tokenType = 1;
    break;
  case '\x14':
    *tokenType = 100;
    break;
  case '\x15':
    *tokenType = 0x66;
    break;
  case '\x16':
    *tokenType = 0x68;
    break;
  case '\x17':
    *tokenType = 0x1a;
    break;
  case '\x18':
    *tokenType = 0x60;
    break;
  case '\x19':
    *tokenType = 0x6b;
    break;
  case '\x1a':
    if ((ulong)z[1] - 0x3a < 0xfffffffffffffff6) {
      *tokenType = 0x86;
      break;
    }
    goto switchD_00156c4c_caseD_3;
  default:
switchD_00156c4c_caseD_1b:
    *tokenType = 0xaf;
    break;
  case '\x1c':
    *tokenType = 0xaf;
    uVar9 = 0;
    goto LAB_0015716f;
  }
  uVar9 = 1;
LAB_0015716f:
  return (int)uVar9;
  while ((uVar8 = uVar8 + 1, uVar12 != 0x29 && ((""[uVar12] & 1) == 0))) {
LAB_00157180:
    pbVar5 = pbVar5 + 1;
    uVar9 = (ulong)uVar8;
    uVar12 = (ulong)*pbVar5;
    if (uVar12 == 0) goto LAB_001571b1;
  }
  if (*pbVar5 == 0x29) {
    bVar13 = false;
    uVar9 = (ulong)uVar8;
  }
  else {
LAB_001571b1:
    *tokenType = 0xaf;
    bVar13 = false;
  }
LAB_0015707e:
  if (!bVar13) goto LAB_0015716f;
LAB_00157086:
  *tokenType = 0xaf;
  goto LAB_0015716f;
switchD_00156c4c_caseD_3:
  *tokenType = 0x93;
  if (((*z == '0') && ((z[1] | 0x20) == 0x78)) && ((""[z[2]] & 8) != 0)) {
    lVar3 = 3;
    do {
      pbVar5 = z + lVar3;
      lVar3 = lVar3 + 1;
    } while ((""[*pbVar5] & 8) != 0);
    uVar9 = (ulong)((int)lVar3 - 1);
  }
  else {
    uVar9 = 0xffffffffffffffff;
    do {
      lVar3 = uVar9 + 1;
      uVar9 = uVar9 + 1;
    } while (0xfffffffffffffff5 < (ulong)z[lVar3] - 0x3a);
    if (z[lVar3] == 0x2e) {
      do {
        lVar3 = uVar9 + 1;
        uVar9 = uVar9 + 1;
      } while (0xfffffffffffffff5 < (ulong)z[lVar3] - 0x3a);
      *tokenType = 0x91;
    }
    iVar7 = (int)uVar9;
    if (((z[iVar7] | 0x20) == 0x65) &&
       ((bVar10 = z[(long)iVar7 + 1], 0xfffffffffffffff5 < (ulong)bVar10 - 0x3a ||
        (((bVar10 == 0x2d || (bVar10 == 0x2b)) &&
         (0xfffffffffffffff5 < (ulong)z[(long)iVar7 + 2] - 0x3a)))))) {
      uVar9 = (long)(iVar7 + 2) - 1;
      do {
        lVar3 = uVar9 + 1;
        uVar9 = uVar9 + 1;
      } while (0xfffffffffffffff5 < (ulong)z[lVar3] - 0x3a);
      *tokenType = 0x91;
    }
    if ((""[z[(int)uVar9]] & 0x46) != 0) {
      pbVar5 = z + (int)uVar9;
      do {
        pbVar5 = pbVar5 + 1;
        *tokenType = 0xaf;
        uVar9 = (ulong)((int)uVar9 + 1);
      } while ((""[*pbVar5] & 0x46) != 0);
    }
  }
  goto LAB_0015716f;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetToken(const unsigned char *z, int *tokenType){
  int i, c;
  switch( aiClass[*z] ){  /* Switch on the character-class of the first byte
                          ** of the token. See the comment on the CC_ defines
                          ** above. */
    case CC_SPACE: {
      testcase( z[0]==' ' );
      testcase( z[0]=='\t' );
      testcase( z[0]=='\n' );
      testcase( z[0]=='\f' );
      testcase( z[0]=='\r' );
      for(i=1; sqlite3Isspace(z[i]); i++){}
      *tokenType = TK_SPACE;
      return i;
    }
    case CC_MINUS: {
      if( z[1]=='-' ){
        for(i=2; (c=z[i])!=0 && c!='\n'; i++){}
        *tokenType = TK_SPACE;   /* IMP: R-22934-25134 */
        return i;
      }
      *tokenType = TK_MINUS;
      return 1;
    }
    case CC_LP: {
      *tokenType = TK_LP;
      return 1;
    }
    case CC_RP: {
      *tokenType = TK_RP;
      return 1;
    }
    case CC_SEMI: {
      *tokenType = TK_SEMI;
      return 1;
    }
    case CC_PLUS: {
      *tokenType = TK_PLUS;
      return 1;
    }
    case CC_STAR: {
      *tokenType = TK_STAR;
      return 1;
    }
    case CC_SLASH: {
      if( z[1]!='*' || z[2]==0 ){
        *tokenType = TK_SLASH;
        return 1;
      }
      for(i=3, c=z[2]; (c!='*' || z[i]!='/') && (c=z[i])!=0; i++){}
      if( c ) i++;
      *tokenType = TK_SPACE;   /* IMP: R-22934-25134 */
      return i;
    }
    case CC_PERCENT: {
      *tokenType = TK_REM;
      return 1;
    }
    case CC_EQ: {
      *tokenType = TK_EQ;
      return 1 + (z[1]=='=');
    }
    case CC_LT: {
      if( (c=z[1])=='=' ){
        *tokenType = TK_LE;
        return 2;
      }else if( c=='>' ){
        *tokenType = TK_NE;
        return 2;
      }else if( c=='<' ){
        *tokenType = TK_LSHIFT;
        return 2;
      }else{
        *tokenType = TK_LT;
        return 1;
      }
    }
    case CC_GT: {
      if( (c=z[1])=='=' ){
        *tokenType = TK_GE;
        return 2;
      }else if( c=='>' ){
        *tokenType = TK_RSHIFT;
        return 2;
      }else{
        *tokenType = TK_GT;
        return 1;
      }
    }
    case CC_BANG: {
      if( z[1]!='=' ){
        *tokenType = TK_ILLEGAL;
        return 1;
      }else{
        *tokenType = TK_NE;
        return 2;
      }
    }
    case CC_PIPE: {
      if( z[1]!='|' ){
        *tokenType = TK_BITOR;
        return 1;
      }else{
        *tokenType = TK_CONCAT;
        return 2;
      }
    }
    case CC_COMMA: {
      *tokenType = TK_COMMA;
      return 1;
    }
    case CC_AND: {
      *tokenType = TK_BITAND;
      return 1;
    }
    case CC_TILDA: {
      *tokenType = TK_BITNOT;
      return 1;
    }
    case CC_QUOTE: {
      int delim = z[0];
      testcase( delim=='`' );
      testcase( delim=='\'' );
      testcase( delim=='"' );
      for(i=1; (c=z[i])!=0; i++){
        if( c==delim ){
          if( z[i+1]==delim ){
            i++;
          }else{
            break;
          }
        }
      }
      if( c=='\'' ){
        *tokenType = TK_STRING;
        return i+1;
      }else if( c!=0 ){
        *tokenType = TK_ID;
        return i+1;
      }else{
        *tokenType = TK_ILLEGAL;
        return i;
      }
    }
    case CC_DOT: {
#ifndef SQLITE_OMIT_FLOATING_POINT
      if( !sqlite3Isdigit(z[1]) )
#endif
      {
        *tokenType = TK_DOT;
        return 1;
      }
      /* If the next character is a digit, this is a floating point
      ** number that begins with ".".  Fall thru into the next case */
    }
    case CC_DIGIT: {
      testcase( z[0]=='0' );  testcase( z[0]=='1' );  testcase( z[0]=='2' );
      testcase( z[0]=='3' );  testcase( z[0]=='4' );  testcase( z[0]=='5' );
      testcase( z[0]=='6' );  testcase( z[0]=='7' );  testcase( z[0]=='8' );
      testcase( z[0]=='9' );
      *tokenType = TK_INTEGER;
#ifndef SQLITE_OMIT_HEX_INTEGER
      if( z[0]=='0' && (z[1]=='x' || z[1]=='X') && sqlite3Isxdigit(z[2]) ){
        for(i=3; sqlite3Isxdigit(z[i]); i++){}
        return i;
      }
#endif
      for(i=0; sqlite3Isdigit(z[i]); i++){}
#ifndef SQLITE_OMIT_FLOATING_POINT
      if( z[i]=='.' ){
        i++;
        while( sqlite3Isdigit(z[i]) ){ i++; }
        *tokenType = TK_FLOAT;
      }
      if( (z[i]=='e' || z[i]=='E') &&
           ( sqlite3Isdigit(z[i+1]) 
            || ((z[i+1]=='+' || z[i+1]=='-') && sqlite3Isdigit(z[i+2]))
           )
      ){
        i += 2;
        while( sqlite3Isdigit(z[i]) ){ i++; }
        *tokenType = TK_FLOAT;
      }
#endif
      while( IdChar(z[i]) ){
        *tokenType = TK_ILLEGAL;
        i++;
      }
      return i;
    }
    case CC_QUOTE2: {
      for(i=1, c=z[0]; c!=']' && (c=z[i])!=0; i++){}
      *tokenType = c==']' ? TK_ID : TK_ILLEGAL;
      return i;
    }
    case CC_VARNUM: {
      *tokenType = TK_VARIABLE;
      for(i=1; sqlite3Isdigit(z[i]); i++){}
      return i;
    }
    case CC_DOLLAR:
    case CC_VARALPHA: {
      int n = 0;
      testcase( z[0]=='$' );  testcase( z[0]=='@' );
      testcase( z[0]==':' );  testcase( z[0]=='#' );
      *tokenType = TK_VARIABLE;
      for(i=1; (c=z[i])!=0; i++){
        if( IdChar(c) ){
          n++;
#ifndef SQLITE_OMIT_TCL_VARIABLE
        }else if( c=='(' && n>0 ){
          do{
            i++;
          }while( (c=z[i])!=0 && !sqlite3Isspace(c) && c!=')' );
          if( c==')' ){
            i++;
          }else{
            *tokenType = TK_ILLEGAL;
          }
          break;
        }else if( c==':' && z[i+1]==':' ){
          i++;
#endif
        }else{
          break;
        }
      }
      if( n==0 ) *tokenType = TK_ILLEGAL;
      return i;
    }
    case CC_KYWD: {
      for(i=1; aiClass[z[i]]<=CC_KYWD; i++){}
      if( IdChar(z[i]) ){
        /* This token started out using characters that can appear in keywords,
        ** but z[i] is a character not allowed within keywords, so this must
        ** be an identifier instead */
        i++;
        break;
      }
      *tokenType = TK_ID;
      return keywordCode((char*)z, i, tokenType);
    }
    case CC_X: {
#ifndef SQLITE_OMIT_BLOB_LITERAL
      testcase( z[0]=='x' ); testcase( z[0]=='X' );
      if( z[1]=='\'' ){
        *tokenType = TK_BLOB;
        for(i=2; sqlite3Isxdigit(z[i]); i++){}
        if( z[i]!='\'' || i%2 ){
          *tokenType = TK_ILLEGAL;
          while( z[i] && z[i]!='\'' ){ i++; }
        }
        if( z[i] ) i++;
        return i;
      }
#endif
      /* If it is not a BLOB literal, then it must be an ID, since no
      ** SQL keywords start with the letter 'x'.  Fall through */
    }
    case CC_ID: {
      i = 1;
      break;
    }
    case CC_NUL: {
      *tokenType = TK_ILLEGAL;
      return 0;
    }
    default: {
      *tokenType = TK_ILLEGAL;
      return 1;
    }
  }
  while( IdChar(z[i]) ){ i++; }
  *tokenType = TK_ID;
  return i;
}